

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  ParamIterator<std::tuple<int,_int>_> *in_RDI;
  bool dummy [2];
  bool at_end;
  undefined1 local_21;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  undefined1 in_stack_fffffffffffffff5;
  undefined1 in_stack_fffffffffffffff6;
  undefined1 uVar2;
  undefined1 uVar3;
  
  uVar2 = 0;
  uVar1 = 1;
  std::
  get<0ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>,testing::internal::ParamIterator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
              *)0xb5da73);
  std::
  get<0ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>,testing::internal::ParamIterator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
              *)0xb5da86);
  uVar1 = ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>::
          operator==((ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>
                      *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffff6,
                                                CONCAT15(in_stack_fffffffffffffff5,
                                                         CONCAT14(uVar1,in_stack_fffffffffffffff0)))
                                ),
                     (ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>
                      *)in_RDI);
  local_21 = true;
  if (!(bool)uVar1) {
    uVar2 = uVar1;
    uVar3 = uVar1;
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>,testing::internal::ParamIterator<std::tuple<int,int>>>
              ((tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                *)0xb5dad3);
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>,testing::internal::ParamIterator<std::tuple<int,int>>>
              ((tuple<testing::internal::ParamIterator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                *)0xb5dae5);
    local_21 = ParamIterator<std::tuple<int,_int>_>::operator==
                         ((ParamIterator<std::tuple<int,_int>_> *)
                          CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffff6,
                                                  CONCAT15(uVar2,CONCAT14(uVar1,
                                                  in_stack_fffffffffffffff0)))),in_RDI);
  }
  return local_21;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }